

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O0

void quicly_local_cid_on_acked(quicly_local_cid_set_t *set,uint64_t sequence)

{
  size_t idx;
  quicly_local_cid_set_t *in_RSI;
  quicly_local_cid_set_t *in_RDI;
  size_t i;
  
  idx = find_index(in_RDI,(uint64_t)in_RSI);
  if (idx != 0xffffffffffffffff) {
    do_mark_delivered(in_RSI,idx);
  }
  return;
}

Assistant:

void quicly_local_cid_on_acked(quicly_local_cid_set_t *set, uint64_t sequence)
{
    size_t i = find_index(set, sequence);
    if (i == SIZE_MAX)
        return;

    do_mark_delivered(set, i);
}